

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

HighsDomainChange __thiscall HighsDomain::backtrack(HighsDomain *this)

{
  pointer *ppiVar1;
  bool bVar2;
  Reason reason;
  pointer ppVar3;
  pointer pHVar4;
  pointer pRVar5;
  pointer piVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  long lVar16;
  int iVar17;
  double dVar18;
  HighsDomainChange HVar19;
  undefined8 local_78;
  HighsDomainChange local_40;
  
  uVar10 = (ulong)((long)(this->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  bVar2 = this->infeasible_;
  reason = this->infeasible_reason;
  iVar9 = (int)uVar10;
  if ((bVar2 == true) && (this->infeasible_pos == iVar9)) {
    this->infeasible_ = false;
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
  }
  uVar10 = uVar10 & 0xffffffff;
  lVar14 = uVar10 * 0x10;
  lVar7 = 0;
  uVar11 = uVar10;
  do {
    lVar16 = lVar7;
    uVar12 = uVar11 - 1;
    iVar17 = (int)uVar11;
    if (iVar17 < 1) goto LAB_00296a9d;
    ppVar3 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_40.boundval = *(double *)((long)&ppVar3[uVar10 - 1].first + lVar16 * 2);
    pHVar4 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40.boundtype = *(HighsBoundType *)((long)pHVar4 + lVar16 * 2 + lVar14 + -4);
    pvVar15 = &this->colUpperPos_;
    if (local_40.boundtype == kLower) {
      pvVar15 = &this->colLowerPos_;
    }
    (pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[*(int *)((long)pHVar4 + lVar16 * 2 + lVar14 + -8)] =
         *(int *)((long)ppVar3 + lVar16 * 2 + lVar14 + -8);
    local_40.column = *(HighsInt *)((long)pHVar4 + lVar16 * 2 + lVar14 + -8);
    doChangeBound(this,&local_40);
    if ((this->infeasible_ == true) && (uVar12 == (uint)this->infeasible_pos)) {
      this->infeasible_ = false;
      (this->infeasible_reason).type = -2;
      (this->infeasible_reason).index = 0;
    }
    lVar7 = lVar16 + -8;
    uVar11 = uVar12;
  } while (*(int *)((long)&(this->domchgreason_).
                           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1].type + lVar16) !=
           -1);
  ppiVar1 = &(this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar1 = *ppiVar1 + -1;
LAB_00296a9d:
  if (bVar2 != false) {
    markPropagateCut(this,reason);
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    this->infeasible_ = false;
  }
  iVar13 = (int)((ulong)((long)(this->domchgreason_).
                               super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->domchgreason_).
                              super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar17 < iVar13) {
    lVar16 = (long)iVar9 * 8 + lVar16;
    iVar13 = iVar13 - iVar17;
    do {
      markPropagateCut(this,*(Reason *)
                             ((long)&((this->domchgreason_).
                                      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->type + lVar16));
      lVar16 = lVar16 + 8;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  if (iVar17 < 1) {
    pHVar4 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->domchgstack_).
        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish != pHVar4) {
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar4;
    }
    ppVar3 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->prevboundval_).
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish != ppVar3) {
      (this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar3;
    }
    pRVar5 = (this->domchgreason_).
             super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->domchgreason_).
        super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar5) {
      (this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish = pRVar5;
    }
    piVar6 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78 = 0xffffffff;
    dVar18 = 0.0;
    uVar8 = 0xffffffff;
    if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar6) {
      (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar6;
      uVar8 = local_78;
    }
  }
  else {
    uVar12 = uVar12 & 0xffffffff;
    pHVar4 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar18 = pHVar4[uVar12].boundval;
    uVar8._0_4_ = pHVar4[uVar12].column;
    uVar8._4_4_ = pHVar4[uVar12].boundtype;
    if (pHVar4 + uVar12 !=
        (this->domchgstack_).
        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar4 + uVar12;
    }
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::resize
              (&this->domchgreason_,uVar12);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&this->prevboundval_,uVar12);
  }
  local_78 = uVar8;
  HVar19.column = (undefined4)local_78;
  HVar19.boundtype = local_78._4_4_;
  HVar19.boundval = dVar18;
  return HVar19;
}

Assistant:

HighsDomainChange HighsDomain::backtrack() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }
  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    // change back to global bound
    doChangeBound(
        {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    if (domchgreason_[k].type == Reason::kBranching) {
      branchPos_.pop_back();
      break;
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  if (k < 0) {
    domchgstack_.clear();
    prevboundval_.clear();
    domchgreason_.clear();
    branchPos_.clear();
    return HighsDomainChange({0.0, -1, HighsBoundType::kLower});
  }

  HighsDomainChange backtrackboundchg = domchgstack_[k];
  domchgstack_.erase(domchgstack_.begin() + k, domchgstack_.end());
  domchgreason_.resize(k);
  prevboundval_.resize(k);

  return backtrackboundchg;
}